

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
calculator::DivZeroException::DivZeroException(DivZeroException *this,double x,int y)

{
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  double dStack_18;
  int y_local;
  double x_local;
  DivZeroException *this_local;
  
  local_1c = y;
  dStack_18 = x;
  x_local = (double)this;
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__DivZeroException_00136878;
  std::__cxx11::to_string(&local_a0,dStack_18);
  std::operator+(&local_80,"Error: div zero/0 error: ",&local_a0);
  std::operator+(&local_60,&local_80,"/");
  std::__cxx11::to_string(&local_d0,local_1c);
  std::operator+(&local_40,&local_60,&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_40
            );
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

DivZeroException(double x, int y) {
        error_msg = "Error: div zero/0 error: " + std::to_string(x) + "/" +
                    std::to_string(y);
    }